

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::impl::anon_unknown_0::xpath_lexer::next(xpath_lexer *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar3 = (byte *)this->_cur;
  do {
    pbVar4 = pbVar3;
    pbVar3 = pbVar4 + 1;
  } while (((anonymous_namespace)::chartype_table[*pbVar4] & 8) != 0);
  this->_cur_lexeme_pos = (char_t *)pbVar4;
  bVar1 = *pbVar4;
  if (0x5a < bVar1) {
    if (bVar1 == 0x5b) {
      this->_cur_lexeme = lex_open_square_brace;
      goto LAB_001636c2;
    }
    if (bVar1 == 0x5d) {
      this->_cur_lexeme = lex_close_square_brace;
      goto LAB_001636c2;
    }
    if (bVar1 == 0x7c) {
      this->_cur_lexeme = lex_union;
      goto LAB_001636c2;
    }
    goto switchD_0016342f_caseD_23;
  }
  switch(bVar1) {
  case 0x21:
    if (*pbVar3 == 0x3d) {
      pbVar3 = pbVar4 + 2;
      this->_cur_lexeme = lex_not_equal;
      break;
    }
    goto LAB_00163601;
  case 0x22:
  case 0x27:
    (this->_cur_lexeme_contents).begin = (char_t *)pbVar3;
    do {
      pbVar4 = pbVar3;
      pbVar3 = pbVar4 + 1;
      if (*pbVar4 == 0) break;
    } while (*pbVar4 != bVar1);
    (this->_cur_lexeme_contents).end = (char_t *)pbVar4;
    if (*pbVar4 != 0) {
      this->_cur_lexeme = lex_quoted_string;
      break;
    }
    goto LAB_00163601;
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x3f:
    goto switchD_0016342f_caseD_23;
  case 0x24:
    if (((anonymous_namespace)::chartypex_table[*pbVar3] & 4) == 0) {
      this->_cur_lexeme = lex_none;
    }
    else {
      (this->_cur_lexeme_contents).begin = (char_t *)pbVar3;
      do {
        pbVar2 = pbVar4;
        pbVar3 = pbVar2 + 1;
        pbVar4 = pbVar3;
      } while (((anonymous_namespace)::chartypex_table[pbVar2[1]] & 0x10) != 0);
      if (pbVar2[1] == 0x3a) {
        bVar1 = pbVar2[2];
        while (((anonymous_namespace)::chartypex_table[bVar1] & 0x10) != 0) {
          bVar1 = pbVar3[1];
          pbVar3 = pbVar3 + 1;
        }
      }
      (this->_cur_lexeme_contents).end = (char_t *)pbVar3;
      this->_cur_lexeme = lex_var_ref;
    }
    break;
  case 0x28:
    this->_cur_lexeme = lex_open_brace;
    break;
  case 0x29:
    this->_cur_lexeme = lex_close_brace;
    break;
  case 0x2a:
    this->_cur_lexeme = lex_multiply;
    break;
  case 0x2b:
    this->_cur_lexeme = lex_plus;
    break;
  case 0x2c:
    this->_cur_lexeme = lex_comma;
    break;
  case 0x2d:
    this->_cur_lexeme = lex_minus;
    break;
  case 0x2e:
    if ((ulong)*pbVar3 == 0x2e) {
      pbVar3 = pbVar4 + 2;
      this->_cur_lexeme = lex_double_dot;
      break;
    }
    if ((ulong)*pbVar3 - 0x3a < 0xfffffffffffffff6) {
      this->_cur_lexeme = lex_dot;
      break;
    }
    (this->_cur_lexeme_contents).begin = (char_t *)pbVar4;
    pbVar3 = pbVar4;
    do {
      pbVar4 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    } while (0xfffffffffffffff5 < (ulong)*pbVar4 - 0x3a);
    goto LAB_001636db;
  case 0x2f:
    if (*pbVar3 == 0x2f) {
      pbVar3 = pbVar4 + 2;
      this->_cur_lexeme = lex_double_slash;
    }
    else {
      this->_cur_lexeme = lex_slash;
    }
    break;
  case 0x3a:
    if (*pbVar3 == 0x3a) {
      pbVar3 = pbVar4 + 2;
      this->_cur_lexeme = lex_double_colon;
      break;
    }
    goto LAB_00163601;
  case 0x3c:
    if (*pbVar3 == 0x3d) {
      pbVar3 = pbVar4 + 2;
      this->_cur_lexeme = lex_less_or_equal;
    }
    else {
      this->_cur_lexeme = lex_less;
    }
    break;
  case 0x3d:
    this->_cur_lexeme = lex_equal;
    break;
  case 0x3e:
    if (*pbVar3 == 0x3d) {
      pbVar3 = pbVar4 + 2;
      this->_cur_lexeme = lex_greater_or_equal;
    }
    else {
      this->_cur_lexeme = lex_greater;
    }
    break;
  case 0x40:
    this->_cur_lexeme = lex_axis_attribute;
    break;
  default:
    if (bVar1 == 0) {
      this->_cur_lexeme = lex_eof;
      pbVar3 = pbVar4;
      break;
    }
switchD_0016342f_caseD_23:
    if (((anonymous_namespace)::chartypex_table[bVar1] & 8) != 0) {
      pbVar3 = pbVar4 + -1;
      (this->_cur_lexeme_contents).begin = (char_t *)pbVar4;
      do {
        pbVar4 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while (0xfffffffffffffff5 < (ulong)*pbVar4 - 0x3a);
      if (*pbVar4 == 0x2e) {
        do {
          pbVar4 = pbVar3 + 1;
          pbVar3 = pbVar3 + 1;
        } while (0xfffffffffffffff5 < (ulong)*pbVar4 - 0x3a);
      }
LAB_001636db:
      (this->_cur_lexeme_contents).end = (char_t *)pbVar3;
      this->_cur_lexeme = lex_number;
      break;
    }
    if (((anonymous_namespace)::chartypex_table[bVar1] & 4) != 0) {
      (this->_cur_lexeme_contents).begin = (char_t *)pbVar4;
      do {
        pbVar4 = pbVar3;
        pbVar3 = pbVar4 + 1;
      } while (((anonymous_namespace)::chartypex_table[pbVar4[-1]] & 0x10) != 0);
      pbVar3 = pbVar4 + -1;
      if ((pbVar4[-1] == 0x3a) && (pbVar3 = pbVar4 + 1, (ulong)*pbVar4 != 0x2a)) {
        bVar1 = (anonymous_namespace)::chartypex_table[*pbVar4];
        pbVar3 = pbVar4 + -1;
        while ((bVar1 & 0x10) != 0) {
          pbVar4 = pbVar3 + 1;
          pbVar3 = pbVar3 + 1;
          bVar1 = (anonymous_namespace)::chartypex_table[*pbVar4];
        }
      }
      (this->_cur_lexeme_contents).end = (char_t *)pbVar3;
      this->_cur_lexeme = lex_string;
      break;
    }
LAB_00163601:
    pbVar3 = pbVar4;
    this->_cur_lexeme = lex_none;
  }
LAB_001636c2:
  this->_cur = (char_t *)pbVar3;
  return;
}

Assistant:

void next()
		{
			const char_t* cur = _cur;

			while (PUGI_IMPL_IS_CHARTYPE(*cur, ct_space)) ++cur;

			// save lexeme position for error reporting
			_cur_lexeme_pos = cur;

			switch (*cur)
			{
			case 0:
				_cur_lexeme = lex_eof;
				break;

			case '>':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_greater_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_greater;
				}
				break;

			case '<':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_less_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_less;
				}
				break;

			case '!':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_not_equal;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			case '=':
				cur += 1;
				_cur_lexeme = lex_equal;

				break;

			case '+':
				cur += 1;
				_cur_lexeme = lex_plus;

				break;

			case '-':
				cur += 1;
				_cur_lexeme = lex_minus;

				break;

			case '*':
				cur += 1;
				_cur_lexeme = lex_multiply;

				break;

			case '|':
				cur += 1;
				_cur_lexeme = lex_union;

				break;

			case '$':
				cur += 1;

				if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':' && PUGI_IMPL_IS_CHARTYPEX(cur[1], ctx_symbol)) // qname
					{
						cur++; // :

						while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_var_ref;
				}
				else
				{
					_cur_lexeme = lex_none;
				}

				break;

			case '(':
				cur += 1;
				_cur_lexeme = lex_open_brace;

				break;

			case ')':
				cur += 1;
				_cur_lexeme = lex_close_brace;

				break;

			case '[':
				cur += 1;
				_cur_lexeme = lex_open_square_brace;

				break;

			case ']':
				cur += 1;
				_cur_lexeme = lex_close_square_brace;

				break;

			case ',':
				cur += 1;
				_cur_lexeme = lex_comma;

				break;

			case '/':
				if (*(cur+1) == '/')
				{
					cur += 2;
					_cur_lexeme = lex_double_slash;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_slash;
				}
				break;

			case '.':
				if (*(cur+1) == '.')
				{
					cur += 2;
					_cur_lexeme = lex_double_dot;
				}
				else if (PUGI_IMPL_IS_CHARTYPEX(*(cur+1), ctx_digit))
				{
					_cur_lexeme_contents.begin = cur; // .

					++cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_dot;
				}
				break;

			case '@':
				cur += 1;
				_cur_lexeme = lex_axis_attribute;

				break;

			case '"':
			case '\'':
			{
				char_t terminator = *cur;

				++cur;

				_cur_lexeme_contents.begin = cur;
				while (*cur && *cur != terminator) cur++;
				_cur_lexeme_contents.end = cur;

				if (!*cur)
					_cur_lexeme = lex_none;
				else
				{
					cur += 1;
					_cur_lexeme = lex_quoted_string;
				}

				break;
			}

			case ':':
				if (*(cur+1) == ':')
				{
					cur += 2;
					_cur_lexeme = lex_double_colon;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			default:
				if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					if (*cur == '.')
					{
						cur++;

						while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':')
					{
						if (cur[1] == '*') // namespace test ncname:*
						{
							cur += 2; // :*
						}
						else if (PUGI_IMPL_IS_CHARTYPEX(cur[1], ctx_symbol)) // namespace test qname
						{
							cur++; // :

							while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
						}
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_string;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
			}

			_cur = cur;
		}